

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

void __thiscall QCborContainerPrivate::appendAsciiString(QCborContainerPrivate *this,QStringView s)

{
  char *pcVar1;
  long in_FS_OFFSET;
  anon_union_8_2_4ee71171_for_Element_0 local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.value = addByteData(this,(char *)0x0,s.m_size);
  local_30 = 0xa00000060;
  QList<QtCbor::Element>::emplaceBack<QtCbor::Element_const&>(&this->elements,(Element *)&local_38);
  pcVar1 = QByteArray::data(&this->data);
  qt_to_latin1_unchecked((uchar *)(pcVar1 + (long)local_38.container + 8),s.m_data,s.m_size);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void QCborContainerPrivate::appendAsciiString(QStringView s)
{
    qsizetype len = s.size();
    QtCbor::Element e;
    e.value = addByteData(nullptr, len);
    e.type = QCborValue::String;
    e.flags = Element::HasByteData | Element::StringIsAscii;
    elements.append(e);

    char *ptr = data.data() + e.value + sizeof(ByteData);
    uchar *l = reinterpret_cast<uchar *>(ptr);
    qt_to_latin1_unchecked(l, s.utf16(), len);
}